

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall
VariationalBayesEstimatorOnLDA::writeVariationalLowerBound
          (VariationalBayesEstimatorOnLDA *this,string *VLBFilename,string *VLBTimeSeriesFilename)

{
  pointer pdVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  ofstream VLBTimeSeriesOutput;
  undefined8 auStack_410 [63];
  ofstream VLBOutput;
  undefined8 auStack_210 [63];
  
  std::ofstream::ofstream(&VLBOutput);
  std::ofstream::ofstream(&VLBTimeSeriesOutput);
  std::ofstream::open((string *)&VLBOutput,(_Ios_Openmode)VLBFilename);
  std::ofstream::open((string *)&VLBTimeSeriesOutput,(_Ios_Openmode)VLBTimeSeriesFilename);
  *(undefined8 *)((long)auStack_210 + *(long *)(_VLBOutput + -0x18)) = 0x11;
  poVar2 = std::ostream::_M_insert<double>(this->_variationalLowerBound);
  std::endl<char,std::char_traits<char>>(poVar2);
  *(undefined8 *)((long)auStack_410 + *(long *)(_VLBTimeSeriesOutput + -0x18)) = 0x11;
  for (uVar3 = 0;
      pdVar1 = (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_VLBTimeSeries).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    std::ostream::_M_insert<double>(pdVar1[uVar3]);
    std::endl<char,std::char_traits<char>>((ostream *)&VLBTimeSeriesOutput);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&VLBTimeSeriesOutput);
  std::ofstream::~ofstream(&VLBOutput);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeVariationalLowerBound(string VLBFilename, string VLBTimeSeriesFilename)const{//{{{
    ofstream VLBOutput;
    ofstream VLBTimeSeriesOutput;
    VLBOutput.open(VLBFilename, ios::out);
    VLBTimeSeriesOutput.open(VLBTimeSeriesFilename, ios::out);

    VLBOutput<<setprecision(numeric_limits<double>::max_digits10);
    VLBOutput<<_variationalLowerBound<<endl;
    VLBTimeSeriesOutput<<std::setprecision(std::numeric_limits<double>::max_digits10);
    for(int i=0;i<_VLBTimeSeries.size();i++){
        VLBTimeSeriesOutput<<_VLBTimeSeries[i];
        VLBTimeSeriesOutput<<endl;
    }
    VLBOutput.close();
    VLBTimeSeriesOutput.close();
}